

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_lib.cc
# Opt level: O1

int PEM_read_bio(BIO *bp,char **name,char **header,uchar **data,long *len)

{
  char *__s;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  BUF_MEM *pBVar5;
  BUF_MEM *pBVar6;
  BUF_MEM *pBVar7;
  size_t sVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint7 uVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar10;
  BUF_MEM *orig_ptr;
  BIO *pBVar11;
  BIO *bp_00;
  ulong __n;
  ulong uVar12;
  int iVar13;
  long lVar14;
  int bl;
  int k;
  char buf [256];
  EVP_ENCODE_CTX ctx;
  int local_1bc;
  BUF_MEM *local_1b8;
  BUF_MEM *local_1b0;
  undefined4 local_1a4;
  BUF_MEM *local_1a0;
  int local_194;
  BIO *local_190;
  char **local_188;
  uchar **local_180;
  char **local_178;
  long *local_170;
  char local_168;
  undefined2 uStack_167;
  undefined5 uStack_165;
  char local_160;
  undefined2 local_15f;
  char local_15d [243];
  undefined1 local_6a;
  
  local_1bc = 0;
  local_178 = name;
  local_170 = len;
  pBVar5 = BUF_MEM_new();
  pBVar6 = BUF_MEM_new();
  pBVar7 = BUF_MEM_new();
  if (pBVar7 == (BUF_MEM *)0x0 || (pBVar6 == (BUF_MEM *)0x0 || pBVar5 == (BUF_MEM *)0x0)) {
    BUF_MEM_free(pBVar5);
    BUF_MEM_free(pBVar6);
    goto LAB_0029dcbf;
  }
  local_6a = 0;
  local_1b8 = pBVar6;
  local_1b0 = pBVar5;
  local_1a0 = pBVar7;
  local_188 = header;
  local_180 = data;
  uVar2 = BIO_gets(bp,&local_168,0xfe);
  if (0 < (int)uVar2) {
LAB_0029dbf0:
    do {
      if ((&local_168)[uVar2] < '!') {
        bVar1 = 0 < (int)uVar2;
        uVar2 = uVar2 - 1;
        if (bVar1) goto LAB_0029dbf0;
        uVar2 = 0xffffffff;
      }
      (&local_168)[uVar2 + 1] = '\n';
      (&local_168)[uVar2 + 2] = '\0';
      if (CONCAT26(local_15f,CONCAT15(local_160,uStack_165)) == 0x204e494745422d2d &&
          CONCAT53(uStack_165,CONCAT21(uStack_167,local_168)) == 0x4745422d2d2d2d2d) {
        sVar8 = strlen(local_15d);
        lVar14 = sVar8 << 0x20;
        iVar3 = strncmp(&local_168 + (lVar14 + 0x500000000 >> 0x20),"-----\n",6);
        pBVar5 = local_1b0;
        if (iVar3 == 0) {
          iVar3 = BUF_MEM_grow(local_1b0,lVar14 + 0x900000000 >> 0x20);
          pBVar7 = local_1a0;
          pBVar6 = local_1b8;
          if (CONCAT44(extraout_var,iVar3) == 0) goto LAB_0029dcac;
          sVar8 = lVar14 + -0x600000000 >> 0x20;
          local_190 = bp;
          if (lVar14 + -0x600000000 != 0) {
            memcpy(pBVar5->data,local_15d,sVar8);
          }
          pBVar5->data[sVar8] = '\0';
          iVar3 = BUF_MEM_grow(local_1b8,0x100);
          bp_00 = local_190;
          if (CONCAT44(extraout_var_00,iVar3) == 0) goto LAB_0029dcac;
          *pBVar6->data = '\0';
          uVar2 = BIO_gets(local_190,&local_168,0xfe);
          uVar9 = (uint7)(uint3)(uVar2 >> 8);
          if ((int)uVar2 < 1) {
            local_1a4 = (undefined4)CONCAT71(uVar9,1);
            iVar13 = 0;
            goto LAB_0029de67;
          }
          local_1a4 = (undefined4)CONCAT71(uVar9,1);
          uVar10 = 0;
          pBVar11 = bp_00;
          goto LAB_0029dd8f;
        }
      }
      uVar2 = BIO_gets(bp,&local_168,0xfe);
    } while (0 < (int)uVar2);
  }
  ERR_put_error(9,0,0x6e,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_lib.cc"
                ,0x23f);
  pBVar7 = local_1a0;
  pBVar6 = local_1b8;
  pBVar5 = local_1b0;
  goto LAB_0029dcac;
  while( true ) {
    if (__n != 0) {
      memcpy(local_1b8->data + uVar12,&local_168,__n);
    }
    local_1b8->data[uVar10] = '\0';
    uVar2 = BIO_gets(local_190,&local_168,0xfe);
    pBVar11 = bp_00;
    if ((int)uVar2 < 1) break;
LAB_0029dd8f:
    uVar12 = uVar10 & 0xffffffff;
    iVar3 = (int)uVar10;
    do {
      if (' ' < (&local_168)[uVar2]) goto LAB_0029ddae;
      bVar1 = 0 < (int)uVar2;
      uVar2 = uVar2 - 1;
    } while (bVar1);
    uVar2 = 0xffffffff;
LAB_0029ddae:
    (&local_168)[uVar2 + 1] = '\n';
    __n = (ulong)(uVar2 + 2);
    (&local_168)[__n] = '\0';
    bp_00 = pBVar11;
    iVar13 = iVar3;
    if (local_168 == '\n') break;
    uVar10 = uVar12 + __n;
    iVar13 = (int)uVar10;
    iVar4 = BUF_MEM_grow(local_1b8,(ulong)(iVar13 + 9));
    bp_00 = local_190;
    pBVar7 = local_1a0;
    pBVar6 = local_1b8;
    pBVar5 = local_1b0;
    if (CONCAT44(extraout_var_01,iVar4) == 0) goto LAB_0029dcac;
    if (local_160 == ' ' &&
        CONCAT53(uStack_165,CONCAT21(uStack_167,local_168)) == 0x444e452d2d2d2d2d) {
      local_1a4 = 0;
      bp_00 = pBVar11;
      iVar13 = iVar3;
      break;
    }
  }
LAB_0029de67:
  pBVar7 = local_1a0;
  local_1bc = 0;
  iVar3 = BUF_MEM_grow(local_1a0,0x400);
  pBVar6 = local_1b8;
  pBVar5 = local_1b0;
  if (CONCAT44(extraout_var_02,iVar3) != 0) {
    *pBVar7->data = '\0';
    orig_ptr = local_1b8;
    pBVar6 = pBVar7;
    if ((char)local_1a4 != '\0') {
      uVar2 = BIO_gets(bp_00,&local_168,0xfe);
      orig_ptr = pBVar7;
      pBVar6 = local_1b8;
      iVar13 = local_1bc;
      if (0 < (int)uVar2) {
        do {
          if (' ' < (&local_168)[uVar2]) goto LAB_0029ded5;
          bVar1 = 0 < (int)uVar2;
          uVar2 = uVar2 - 1;
        } while (bVar1);
        uVar2 = 0xffffffff;
LAB_0029ded5:
        (&local_168)[uVar2 + 1] = '\n';
        uVar10 = (long)(int)uVar2 + 2;
        uVar12 = uVar10 & 0xffffffff;
        (&local_168)[uVar12] = '\0';
        if (((int)uVar2 < 0x40) &&
           (local_160 != ' ' ||
            CONCAT53(uStack_165,CONCAT21(uStack_167,local_168)) != 0x444e452d2d2d2d2d)) {
          iVar3 = BUF_MEM_grow_clean(pBVar7,(long)(int)(uVar2 + local_1bc + 0xb));
          pBVar6 = local_1b8;
          pBVar5 = local_1b0;
          if (CONCAT44(extraout_var_03,iVar3) == 0) goto LAB_0029dcac;
          if (uVar12 != 0) {
            memcpy(pBVar7->data + local_1bc,&local_168,uVar12);
          }
          pBVar7->data[(long)local_1bc + uVar10] = '\0';
          local_1bc = local_1bc + (int)uVar10;
          local_168 = '\0';
          uVar2 = BIO_gets(bp_00,&local_168,0xfe);
          pBVar6 = local_1b8;
          iVar13 = local_1bc;
          if (0 < (int)uVar2) {
            do {
              if (' ' < (&local_168)[uVar2]) goto LAB_0029dfad;
              bVar1 = 0 < (int)uVar2;
              uVar2 = uVar2 - 1;
            } while (bVar1);
            uVar2 = 0xffffffff;
LAB_0029dfad:
            (&local_168)[uVar2 + 1] = '\n';
            (&local_168)[uVar2 + 2] = '\0';
          }
        }
      }
    }
    local_1bc = iVar13;
    pBVar5 = local_1b0;
    pBVar7 = orig_ptr;
    if (local_160 == ' ' &&
        CONCAT53(uStack_165,CONCAT21(uStack_167,local_168)) == 0x444e452d2d2d2d2d) {
      __s = local_1b0->data;
      sVar8 = strlen(__s);
      iVar3 = strncmp(__s,(char *)&local_15f,(long)(int)sVar8);
      if ((iVar3 != 0) ||
         (iVar3 = strncmp(&local_168 + ((long)((sVar8 << 0x20) + 0x900000000) >> 0x20),"-----\n",6),
         iVar3 != 0)) goto LAB_0029e059;
      EVP_DecodeInit((EVP_ENCODE_CTX *)&stack0xffffffffffffff98);
      iVar3 = EVP_DecodeUpdate((EVP_ENCODE_CTX *)&stack0xffffffffffffff98,(uchar *)orig_ptr->data,
                               &local_1bc,(uchar *)orig_ptr->data,local_1bc);
      if (iVar3 < 0) {
        iVar3 = 100;
        iVar13 = 0x2ba;
      }
      else {
        iVar3 = EVP_DecodeFinal((EVP_ENCODE_CTX *)&stack0xffffffffffffff98,
                                (uchar *)(orig_ptr->data + local_1bc),&local_194);
        if (-1 < iVar3) {
          lVar14 = (long)local_1bc;
          local_1bc = (int)(lVar14 + local_194);
          if (local_1bc != 0) {
            *local_178 = pBVar5->data;
            *local_188 = pBVar6->data;
            *local_180 = (uchar *)orig_ptr->data;
            *local_170 = lVar14 + local_194;
            OPENSSL_free(pBVar5);
            OPENSSL_free(pBVar6);
            OPENSSL_free(orig_ptr);
            return 1;
          }
          goto LAB_0029dcac;
        }
        iVar3 = 100;
        iVar13 = 0x2bf;
      }
    }
    else {
LAB_0029e059:
      iVar3 = 0x66;
      iVar13 = 0x2b2;
    }
    ERR_put_error(9,0,iVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_lib.cc"
                  ,iVar13);
  }
LAB_0029dcac:
  BUF_MEM_free(pBVar5);
  BUF_MEM_free(pBVar6);
LAB_0029dcbf:
  BUF_MEM_free(pBVar7);
  return 0;
}

Assistant:

int PEM_read_bio(BIO *bp, char **name, char **header, unsigned char **data,
                 long *len) {
  EVP_ENCODE_CTX ctx;
  int end = 0, i, k, bl = 0, hl = 0, nohead = 0;
  char buf[256];
  BUF_MEM *nameB;
  BUF_MEM *headerB;
  BUF_MEM *dataB, *tmpB;

  nameB = BUF_MEM_new();
  headerB = BUF_MEM_new();
  dataB = BUF_MEM_new();
  if ((nameB == NULL) || (headerB == NULL) || (dataB == NULL)) {
    BUF_MEM_free(nameB);
    BUF_MEM_free(headerB);
    BUF_MEM_free(dataB);
    return 0;
  }

  buf[254] = '\0';
  for (;;) {
    i = BIO_gets(bp, buf, 254);

    if (i <= 0) {
      OPENSSL_PUT_ERROR(PEM, PEM_R_NO_START_LINE);
      goto err;
    }

    while ((i >= 0) && (buf[i] <= ' ')) {
      i--;
    }
    buf[++i] = '\n';
    buf[++i] = '\0';

    if (strncmp(buf, "-----BEGIN ", 11) == 0) {
      i = strlen(&(buf[11]));

      if (strncmp(&(buf[11 + i - 6]), "-----\n", 6) != 0) {
        continue;
      }
      if (!BUF_MEM_grow(nameB, i + 9)) {
        goto err;
      }
      OPENSSL_memcpy(nameB->data, &(buf[11]), i - 6);
      nameB->data[i - 6] = '\0';
      break;
    }
  }
  hl = 0;
  if (!BUF_MEM_grow(headerB, 256)) {
    goto err;
  }
  headerB->data[0] = '\0';
  for (;;) {
    i = BIO_gets(bp, buf, 254);
    if (i <= 0) {
      break;
    }

    while ((i >= 0) && (buf[i] <= ' ')) {
      i--;
    }
    buf[++i] = '\n';
    buf[++i] = '\0';

    if (buf[0] == '\n') {
      break;
    }
    if (!BUF_MEM_grow(headerB, hl + i + 9)) {
      goto err;
    }
    if (strncmp(buf, "-----END ", 9) == 0) {
      nohead = 1;
      break;
    }
    OPENSSL_memcpy(&(headerB->data[hl]), buf, i);
    headerB->data[hl + i] = '\0';
    hl += i;
  }

  bl = 0;
  if (!BUF_MEM_grow(dataB, 1024)) {
    goto err;
  }
  dataB->data[0] = '\0';
  if (!nohead) {
    for (;;) {
      i = BIO_gets(bp, buf, 254);
      if (i <= 0) {
        break;
      }

      while ((i >= 0) && (buf[i] <= ' ')) {
        i--;
      }
      buf[++i] = '\n';
      buf[++i] = '\0';

      if (i != 65) {
        end = 1;
      }
      if (strncmp(buf, "-----END ", 9) == 0) {
        break;
      }
      if (i > 65) {
        break;
      }
      if (!BUF_MEM_grow_clean(dataB, i + bl + 9)) {
        goto err;
      }
      OPENSSL_memcpy(&(dataB->data[bl]), buf, i);
      dataB->data[bl + i] = '\0';
      bl += i;
      if (end) {
        buf[0] = '\0';
        i = BIO_gets(bp, buf, 254);
        if (i <= 0) {
          break;
        }

        while ((i >= 0) && (buf[i] <= ' ')) {
          i--;
        }
        buf[++i] = '\n';
        buf[++i] = '\0';

        break;
      }
    }
  } else {
    tmpB = headerB;
    headerB = dataB;
    dataB = tmpB;
    bl = hl;
  }
  i = strlen(nameB->data);
  if ((strncmp(buf, "-----END ", 9) != 0) ||
      (strncmp(nameB->data, &(buf[9]), i) != 0) ||
      (strncmp(&(buf[9 + i]), "-----\n", 6) != 0)) {
    OPENSSL_PUT_ERROR(PEM, PEM_R_BAD_END_LINE);
    goto err;
  }

  EVP_DecodeInit(&ctx);
  i = EVP_DecodeUpdate(&ctx, (unsigned char *)dataB->data, &bl,
                       (unsigned char *)dataB->data, bl);
  if (i < 0) {
    OPENSSL_PUT_ERROR(PEM, PEM_R_BAD_BASE64_DECODE);
    goto err;
  }
  i = EVP_DecodeFinal(&ctx, (unsigned char *)&(dataB->data[bl]), &k);
  if (i < 0) {
    OPENSSL_PUT_ERROR(PEM, PEM_R_BAD_BASE64_DECODE);
    goto err;
  }
  bl += k;

  if (bl == 0) {
    goto err;
  }
  *name = nameB->data;
  *header = headerB->data;
  *data = (unsigned char *)dataB->data;
  *len = bl;
  OPENSSL_free(nameB);
  OPENSSL_free(headerB);
  OPENSSL_free(dataB);
  return 1;
err:
  BUF_MEM_free(nameB);
  BUF_MEM_free(headerB);
  BUF_MEM_free(dataB);
  return 0;
}